

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O0

QRect QHighDpi::toNativePixels<QRect,QScreen>(QRect *value,QScreen *context)

{
  long lVar1;
  QPoint origin;
  undefined1 auVar2 [12];
  QScreen *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  ScaleAndOrigin so;
  QPoint *in_stack_ffffffffffffff90;
  QScreen *scaleFactor;
  undefined4 uStack_20;
  undefined4 local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  scaleFactor = in_RSI;
  QPoint::QPoint(in_stack_ffffffffffffff90);
  auVar2._4_4_ = local_1c;
  auVar2._0_4_ = uStack_20;
  auVar2._8_4_ = 0;
  origin = (QPoint)QHighDpiScaling::scaleAndOrigin(in_RSI,(Point)(auVar2 << 0x20));
  QVar3 = scale(in_RDI,(qreal)scaleFactor,origin);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

T toNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, so.factor, so.origin);
}